

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_5bf3::TestCheckCloseDoesNotHaveSideEffectsWhenPassing::RunImpl
          (TestCheckCloseDoesNotHaveSideEffectsWhenPassing *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  float local_5c;
  int local_58;
  int local_54;
  TestDetails local_50;
  ScopedCurrentTest scopedResults;
  TestResults testResults;
  
  (anonymous_namespace)::g_sideEffect = 0;
  UnitTest::TestResults::TestResults(&testResults,(TestReporter *)0x0);
  ScopedCurrentTest::ScopedCurrentTest(&scopedResults,&testResults,(TestDetails *)0x0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  (anonymous_namespace)::g_sideEffect = (anonymous_namespace)::g_sideEffect + 1;
  local_58 = 1;
  local_5c = 0.1;
  local_54 = local_58;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_50,*ppTVar3,0x139);
  UnitTest::CheckClose<int,int,float>(pTVar1,&local_54,&local_58,&local_5c,&local_50);
  ScopedCurrentTest::~ScopedCurrentTest(&scopedResults);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  testResults.m_testReporter._0_4_ = 1;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_50,*ppTVar3,0x13b);
  UnitTest::CheckEqual<int,int>
            (pTVar1,(int *)&testResults,&(anonymous_namespace)::g_sideEffect,&local_50);
  return;
}

Assistant:

TEST(CheckCloseDoesNotHaveSideEffectsWhenPassing)
{
    g_sideEffect = 0;
    {
        UnitTest::TestResults testResults;
		ScopedCurrentTest scopedResults(testResults);
        CHECK_CLOSE (1, FunctionWithSideEffects(), 0.1f);
    }
    CHECK_EQUAL(1, g_sideEffect);
}